

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

void __thiscall
MemoryLeakDetector::deallocMemory
          (MemoryLeakDetector *this,TestMemoryAllocator *allocator,void *memory,char *file,
          size_t line,bool allocatNodesSeperately)

{
  undefined8 uVar1;
  bool bVar2;
  MemoryLeakDetectorNode *node_00;
  size_t size;
  MemoryLeakDetectorNode *node;
  bool allocatNodesSeperately_local;
  size_t line_local;
  char *file_local;
  void *memory_local;
  TestMemoryAllocator *allocator_local;
  MemoryLeakDetector *this_local;
  
  if (memory != (void *)0x0) {
    node_00 = MemoryLeakDetectorTable::removeNode(&this->memoryTable_,(char *)memory);
    if (node_00 == (MemoryLeakDetectorNode *)0x0) {
      MemoryLeakOutputStringBuffer::reportDeallocateNonAllocatedMemoryFailure
                (&this->outputBuffer_,file,line,allocator,this->reporter_);
    }
    else {
      bVar2 = TestMemoryAllocator::hasBeenDestroyed(allocator);
      if (!bVar2) {
        uVar1 = *(undefined8 *)node_00;
        checkForCorruption(this,node_00,file,line,allocator,allocatNodesSeperately);
        (*allocator->_vptr_TestMemoryAllocator[3])(allocator,memory,uVar1,file,line);
      }
    }
  }
  return;
}

Assistant:

void MemoryLeakDetector::deallocMemory(TestMemoryAllocator* allocator, void* memory, const char* file, size_t line, bool allocatNodesSeperately)
{
    if (memory == NULLPTR) return;

    MemoryLeakDetectorNode* node = memoryTable_.removeNode((char*) memory);
    if (node == NULLPTR) {
        outputBuffer_.reportDeallocateNonAllocatedMemoryFailure(file, line, allocator, reporter_);
        return;
    }
#ifdef CPPUTEST_DISABLE_MEM_CORRUPTION_CHECK
   allocatNodesSeperately = true;
#endif
    if (!allocator->hasBeenDestroyed()) {
        size_t size = node->size_;
        checkForCorruption(node, file, line, allocator, allocatNodesSeperately);
        allocator->free_memory((char*) memory, size, file, line);
    }
}